

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::getConstraintsUpperBound
          (OptimalControlProblem *this,double time,double infinity,VectorDynSize *upperBound)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  uint uVar7;
  Index size;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  _Rb_tree_node_base *p_Var13;
  ostream *poVar14;
  Index index;
  long lVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  _Rb_tree_header *p_Var19;
  undefined1 auVar20 [16];
  ulong in_XMM1_Qb;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ostringstream errorMsg;
  string local_1f8;
  undefined8 local_1d8;
  ulong uStack_1d0;
  double local_1c0;
  undefined4 local_1b8;
  uint uStack_1b4;
  undefined4 uStack_1b0;
  uint uStack_1ac;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8 = infinity;
  uStack_1d0 = in_XMM1_Qb;
  local_1c0 = time;
  uVar8 = iDynTree::VectorDynSize::size();
  uVar7 = getConstraintsDimension(this);
  if (uVar8 != uVar7) {
    getConstraintsDimension(this);
    iDynTree::VectorDynSize::resize((ulong)upperBound);
  }
  lVar9 = iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  p_Var13 = (this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var19 = &(this->m_pimpl->constraintsGroups)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var13 != p_Var19) {
    local_1b8 = (undefined4)local_1d8;
    uStack_1b4 = local_1d8._4_4_ & 0x7fffffff;
    local_1d8 = ABS(local_1d8);
    uStack_1d0 = uStack_1d0 & 0x7fffffffffffffff;
    uStack_1b0 = local_1b8;
    lVar16 = 0;
    uStack_1ac = uStack_1b4;
    do {
      bVar6 = ConstraintsGroup::getUpperBound
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var13 + 2),local_1c0,
                         (VectorDynSize *)(*(undefined8 **)(p_Var13 + 2) + 2));
      if (!bVar6) {
        uVar10 = iDynTree::VectorDynSize::data();
        uVar11 = iDynTree::VectorDynSize::size();
        auVar5 = _DAT_001809f0;
        auVar4 = _DAT_001809e0;
        uVar8 = uVar11;
        if (((uVar10 & 7) == 0) &&
           (uVar8 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar11 <= (long)uVar8)) {
          uVar8 = uVar11;
        }
        if (0 < (long)uVar8) {
          lVar15 = uVar8 - 1;
          auVar20._8_4_ = (int)lVar15;
          auVar20._0_8_ = lVar15;
          auVar20._12_4_ = (int)((ulong)lVar15 >> 0x20);
          auVar20 = auVar20 ^ _DAT_001809f0;
          uVar17 = 0;
          auVar22 = _DAT_001809e0;
          do {
            auVar23 = auVar22 ^ auVar5;
            if ((bool)(~(auVar20._4_4_ < auVar23._4_4_ ||
                        auVar20._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar20._4_4_) & 1)) {
              *(double *)(uVar10 + uVar17 * 8) = local_1d8;
            }
            if (auVar23._12_4_ <= auVar20._12_4_ &&
                (auVar23._8_4_ <= auVar20._8_4_ || auVar23._12_4_ != auVar20._12_4_)) {
              *(double *)(uVar10 + 8 + uVar17 * 8) = local_1d8;
            }
            uVar17 = uVar17 + 2;
            lVar15 = auVar22._8_8_;
            auVar22._0_8_ = auVar22._0_8_ + 2;
            auVar22._8_8_ = lVar15 + 2;
          } while ((uVar8 + 1 & 0xfffffffffffffffe) != uVar17);
        }
        lVar18 = uVar11 - uVar8;
        lVar15 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar8;
        uVar17 = uVar8;
        if (1 < lVar18) {
          do {
            puVar1 = (undefined8 *)(uVar10 + uVar17 * 8);
            *puVar1 = CONCAT44(uStack_1b4,local_1b8);
            puVar1[1] = CONCAT44(uStack_1ac,uStack_1b0);
            uVar17 = uVar17 + 2;
          } while ((long)uVar17 < lVar15);
        }
        if (lVar15 < (long)uVar11) {
          lVar12 = (uVar11 - lVar15) + -1;
          auVar23._8_4_ = (int)lVar12;
          auVar23._0_8_ = lVar12;
          auVar23._12_4_ = (int)((ulong)lVar12 >> 0x20);
          lVar18 = (lVar18 / 2) * 0x10 + uVar8 * 8 + uVar10;
          auVar23 = auVar23 ^ auVar5;
          uVar8 = 0;
          do {
            auVar21._8_4_ = (int)uVar8;
            auVar21._0_8_ = uVar8;
            auVar21._12_4_ = (int)(uVar8 >> 0x20);
            auVar22 = (auVar21 | auVar4) ^ auVar5;
            if ((bool)(~(auVar23._4_4_ < auVar22._4_4_ ||
                        auVar23._0_4_ < auVar22._0_4_ && auVar22._4_4_ == auVar23._4_4_) & 1)) {
              *(double *)(lVar18 + uVar8 * 8) = local_1d8;
            }
            if (auVar22._12_4_ <= auVar23._12_4_ &&
                (auVar22._8_4_ <= auVar23._8_4_ || auVar22._12_4_ != auVar23._12_4_)) {
              *(double *)(lVar18 + 8 + uVar8 * 8) = local_1d8;
            }
            uVar8 = uVar8 + 2;
          } while (((uVar11 - lVar15) + 1 & 0xfffffffffffffffe) != uVar8);
        }
      }
      uVar8 = iDynTree::VectorDynSize::size();
      uVar7 = ConstraintsGroup::constraintsDimension
                        ((ConstraintsGroup *)**(undefined8 **)(p_Var13 + 2));
      if (uVar8 != uVar7) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Upper bound dimension different from dimension of group ",
                   0x38);
        ConstraintsGroup::name_abi_cxx11_
                  (&local_1f8,(ConstraintsGroup *)**(undefined8 **)(p_Var13 + 2));
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_1f8._M_dataplus._M_p,
                             local_1f8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,".",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringbuf::str();
        iDynTree::reportError
                  ("OptimalControlProblem","getConstraintsUpperBound",local_1f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
      lVar15 = iDynTree::VectorDynSize::data();
      iDynTree::VectorDynSize::size();
      uVar11 = iDynTree::VectorDynSize::size();
      uVar8 = lVar9 + lVar16 * 8;
      uVar10 = uVar11;
      if (((uVar8 & 7) == 0) &&
         (uVar10 = (ulong)((uint)(uVar8 >> 3) & 1), (long)uVar11 <= (long)uVar10)) {
        uVar10 = uVar11;
      }
      if (0 < (long)uVar10) {
        uVar17 = 0;
        do {
          *(undefined8 *)(uVar8 + uVar17 * 8) = *(undefined8 *)(lVar15 + uVar17 * 8);
          uVar17 = uVar17 + 1;
        } while (uVar10 != uVar17);
      }
      lVar18 = uVar11 - uVar10;
      uVar17 = (lVar18 - (lVar18 >> 0x3f) & 0xfffffffffffffffeU) + uVar10;
      if (1 < lVar18) {
        do {
          puVar1 = (undefined8 *)(lVar15 + uVar10 * 8);
          uVar3 = puVar1[1];
          puVar2 = (undefined8 *)(uVar8 + uVar10 * 8);
          *puVar2 = *puVar1;
          puVar2[1] = uVar3;
          uVar10 = uVar10 + 2;
        } while ((long)uVar10 < (long)uVar17);
      }
      if ((long)uVar17 < (long)uVar11) {
        do {
          *(undefined8 *)(uVar8 + uVar17 * 8) = *(undefined8 *)(lVar15 + uVar17 * 8);
          uVar17 = uVar17 + 1;
        } while (uVar11 != uVar17);
      }
      lVar15 = iDynTree::VectorDynSize::size();
      lVar16 = lVar16 + lVar15;
      p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
    } while ((_Rb_tree_header *)p_Var13 != p_Var19);
  }
  return true;
}

Assistant:

bool OptimalControlProblem::getConstraintsUpperBound(double time, double infinity, VectorDynSize &upperBound)
        {
            if (upperBound.size() != getConstraintsDimension()) {
                upperBound.resize(getConstraintsDimension());
            }

            Eigen::Map< Eigen::VectorXd > upperBoundMap = toEigen(upperBound);
            Eigen::Index offset = 0;

            for (auto& group : m_pimpl->constraintsGroups){
                if (! group.second->group_ptr->getUpperBound(time, group.second->constraintsBuffer)){
                    toEigen(group.second->constraintsBuffer).setConstant(std::abs(infinity)); //if not upper bounded
                }

                if (group.second->constraintsBuffer.size() != group.second->group_ptr->constraintsDimension()){
                    std::ostringstream errorMsg;
                    errorMsg << "Upper bound dimension different from dimension of group " << group.second->group_ptr->name() << ".";
                    reportError("OptimalControlProblem", "getConstraintsUpperBound", errorMsg.str().c_str());
                    return false;
                }

                upperBoundMap.segment(offset, group.second->constraintsBuffer.size()) = toEigen(group.second->constraintsBuffer);
                offset += group.second->constraintsBuffer.size();
            }

            return true;
        }